

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.h
# Opt level: O1

void __thiscall UnscentedKalmanFilter::~UnscentedKalmanFilter(UnscentedKalmanFilter *this)

{
  ~UnscentedKalmanFilter(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~UnscentedKalmanFilter() {}